

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O3

void __thiscall
sglr::ShaderProgram::ShaderProgram(ShaderProgram *this,ShaderProgramDeclaration *decl)

{
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  byte bVar1;
  VertexToGeometryVarying VVar2;
  GeometryToFragmentVarying GVar3;
  bool bVar4;
  GenericVecType GVar5;
  pointer pcVar6;
  pointer pVVar7;
  pointer pFVar8;
  pointer pFVar9;
  pointer pUVar10;
  vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
  *pvVar11;
  size_t numVaryingInputs;
  vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
  *pvVar12;
  pointer *ppVVar13;
  pointer pVVar14;
  pointer pGVar15;
  pointer pVVar16;
  size_t numVaryingOutputs;
  pointer pVVar17;
  pointer pUVar18;
  ulong uVar19;
  long lVar20;
  pointer *ppVVar21;
  long lVar22;
  allocator_type local_6a;
  allocator_type local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  FragmentShader *local_40;
  GeometryShader *local_38;
  
  ppVVar21 = &(decl->m_vertexToFragmentVaryings).
              super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  ppVVar13 = (pointer *)
             &(decl->m_vertexToGeometryVaryings).
              super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pvVar11 = (vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
             *)&decl->m_vertexToGeometryVaryings;
  if (decl->m_geometryShaderSet == false) {
    ppVVar13 = ppVVar21;
    pvVar11 = &decl->m_vertexToFragmentVaryings;
  }
  rr::VertexShader::VertexShader
            (&this->super_VertexShader,
             ((long)(decl->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(decl->m_vertexAttributes).
                    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
             (long)*ppVVar13 -
             (long)(pvVar11->
                   super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_38 = &this->super_GeometryShader;
  numVaryingOutputs =
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_geometryToFragmentVaryings).
             super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  numVaryingInputs =
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->m_vertexToGeometryVaryings).
             super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (decl->m_geometryShaderSet == false) {
    numVaryingOutputs = 0;
    numVaryingInputs = 0;
  }
  rr::GeometryShader::GeometryShader
            (local_38,numVaryingInputs,numVaryingOutputs,(decl->m_geometryDecl).inputType,
             (decl->m_geometryDecl).outputType,(decl->m_geometryDecl).numOutputVertices,
             (decl->m_geometryDecl).numInvocations);
  local_40 = &this->super_FragmentShader;
  pvVar12 = (vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
             *)&decl->m_vertexToFragmentVaryings;
  if (decl->m_geometryShaderSet != false) {
    ppVVar21 = (pointer *)
               &(decl->m_geometryToFragmentVaryings).
                super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pvVar12 = &decl->m_geometryToFragmentVaryings;
  }
  rr::FragmentShader::FragmentShader
            (local_40,(long)*ppVVar21 -
                      (long)(((_Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                               *)&pvVar12->
                                  super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                             )->_M_impl).super__Vector_impl_data._M_start >> 3,
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(decl->m_fragmentOutputs).
                   super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_00d2ee80;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00d2eeb8;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00d2eed0;
  local_48 = &this->m_attributeNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_48,((long)(decl->m_vertexAttributes).
                           super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(decl->m_vertexAttributes).
                           super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           &local_69);
  this_00 = &this->m_uniforms;
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::vector
            (this_00,((long)(decl->m_uniforms).
                            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(decl->m_uniforms).
                            super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
             &local_6a);
  local_50 = &this->m_vertSrc;
  local_60 = &(this->m_vertSrc).field_2;
  (this->m_vertSrc)._M_dataplus._M_p = (pointer)local_60;
  pcVar6 = (decl->m_vertexSource)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar6,pcVar6 + (decl->m_vertexSource)._M_string_length);
  local_58 = &this->m_fragSrc;
  local_68 = &(this->m_fragSrc).field_2;
  (this->m_fragSrc)._M_dataplus._M_p = (pointer)local_68;
  pcVar6 = (decl->m_fragmentSource)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar6,pcVar6 + (decl->m_fragmentSource)._M_string_length);
  if (decl->m_geometryShaderSet == true) {
    (this->m_geomSrc)._M_dataplus._M_p = (pointer)&(this->m_geomSrc).field_2;
    pcVar6 = (decl->m_geometrySource)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->m_geomSrc,pcVar6,pcVar6 + (decl->m_geometrySource)._M_string_length)
    ;
  }
  else {
    (this->m_geomSrc)._M_dataplus._M_p = (pointer)&(this->m_geomSrc).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_geomSrc,"");
  }
  bVar1 = decl->m_geometryShaderSet;
  this->m_hasGeometryShader = (bool)bVar1;
  pVVar17 = (decl->m_vertexAttributes).
            super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((decl->m_vertexAttributes).
      super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar17) {
    lVar20 = 0;
    lVar22 = 0;
    uVar19 = 0;
    do {
      (this->super_VertexShader).m_inputs.
      super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
      super__Vector_impl_data._M_start[uVar19].type =
           *(GenericVecType *)((long)&pVVar17->type + lVar22);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this->m_attributeNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20));
      uVar19 = uVar19 + 1;
      pVVar17 = (decl->m_vertexAttributes).
                super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x28;
      lVar20 = lVar20 + 0x20;
    } while (uVar19 < (ulong)(((long)(decl->m_vertexAttributes).
                                     super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar17 >> 3
                              ) * -0x3333333333333333));
    bVar1 = this->m_hasGeometryShader;
  }
  if ((bVar1 & 1) == 0) {
    pVVar16 = (decl->m_vertexToFragmentVaryings).
              super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_vertexToFragmentVaryings).
        super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pVVar16) {
      uVar19 = 0;
      do {
        GVar5 = pVVar16[uVar19].type;
        pVVar7 = (this->super_VertexShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].type = GVar5;
        bVar4 = pVVar16[uVar19].flatshade;
        pVVar7[uVar19].flatshade = bVar4;
        pVVar7 = (this->super_FragmentShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].flatshade = bVar4;
        pVVar7[uVar19].type = GVar5;
        uVar19 = uVar19 + 1;
        pVVar16 = (decl->m_vertexToFragmentVaryings).
                  super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar19 < (ulong)((long)(decl->m_vertexToFragmentVaryings).
                                      super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16 >>
                               3));
    }
  }
  else {
    pVVar14 = (decl->m_vertexToGeometryVaryings).
              super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_vertexToGeometryVaryings).
        super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pVVar14) {
      uVar19 = 0;
      do {
        GVar5 = *(GenericVecType *)(pVVar14 + uVar19 * 8);
        pVVar7 = (this->super_VertexShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].type = GVar5;
        VVar2 = pVVar14[uVar19 * 8 + 4];
        pVVar7[uVar19].flatshade = (bool)VVar2;
        pVVar7 = (this->super_GeometryShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].flatshade = (bool)VVar2;
        pVVar7[uVar19].type = GVar5;
        uVar19 = uVar19 + 1;
        pVVar14 = (decl->m_vertexToGeometryVaryings).
                  super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar19 < (ulong)((long)(decl->m_vertexToGeometryVaryings).
                                      super__Vector_base<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >>
                               3));
    }
    pGVar15 = (decl->m_geometryToFragmentVaryings).
              super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((decl->m_geometryToFragmentVaryings).
        super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
        ._M_impl.super__Vector_impl_data._M_finish != pGVar15) {
      uVar19 = 0;
      do {
        GVar5 = *(GenericVecType *)(pGVar15 + uVar19 * 8);
        pVVar7 = (this->super_GeometryShader).m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].type = GVar5;
        GVar3 = pGVar15[uVar19 * 8 + 4];
        pVVar7[uVar19].flatshade = (bool)GVar3;
        pVVar7 = (this->super_FragmentShader).m_inputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar7[uVar19].flatshade = (bool)GVar3;
        pVVar7[uVar19].type = GVar5;
        uVar19 = uVar19 + 1;
        pGVar15 = (decl->m_geometryToFragmentVaryings).
                  super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar19 < (ulong)((long)(decl->m_geometryToFragmentVaryings).
                                      super__Vector_base<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar15 >>
                               3));
    }
  }
  pFVar8 = (decl->m_fragmentOutputs).
           super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar20 = (long)(decl->m_fragmentOutputs).
                 super__Vector_base<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8;
  if (lVar20 != 0) {
    lVar20 = lVar20 >> 2;
    pFVar9 = (this->super_FragmentShader).m_outputs.
             super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar22 = 0;
    do {
      pFVar9[lVar22].type = pFVar8[lVar22].type;
      lVar22 = lVar22 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar22);
  }
  if ((decl->m_uniforms).
      super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (decl->m_uniforms).
      super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pUVar18 = (this_00->super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    lVar22 = 0;
    uVar19 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)((long)&(pUVar18->name)._M_dataplus._M_p + lVar20));
      pUVar10 = (decl->m_uniforms).
                super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pUVar18 = (this_00->super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)&pUVar18->type + lVar20) =
           *(undefined4 *)((long)&pUVar10->type + lVar22);
      uVar19 = uVar19 + 1;
      lVar22 = lVar22 + 0x28;
      lVar20 = lVar20 + 0x70;
    } while (uVar19 < (ulong)(((long)(decl->m_uniforms).
                                     super__Vector_base<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar10 >> 3
                              ) * -0x3333333333333333));
  }
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const pdec::ShaderProgramDeclaration& decl)
	: rr::VertexShader		(decl.getVertexInputCount(), decl.getVertexOutputCount())
	, rr::GeometryShader	(decl.getGeometryInputCount(),
							 decl.getGeometryOutputCount(),
							 decl.m_geometryDecl.inputType,
							 decl.m_geometryDecl.outputType,
							 decl.m_geometryDecl.numOutputVertices,
							 decl.m_geometryDecl.numInvocations)
	, rr::FragmentShader	(decl.getFragmentInputCount(), decl.getFragmentOutputCount())
	, m_attributeNames		(decl.getVertexInputCount())
	, m_uniforms			(decl.m_uniforms.size())
	, m_vertSrc				(decl.m_vertexSource)
	, m_fragSrc				(decl.m_fragmentSource)
	, m_geomSrc				(decl.hasGeometryShader() ? (decl.m_geometrySource) : (""))
	, m_hasGeometryShader	(decl.hasGeometryShader())
{
	DE_ASSERT(decl.valid());

	// Set up shader IO

	for (size_t ndx = 0; ndx < decl.m_vertexAttributes.size(); ++ndx)
	{
		this->rr::VertexShader::m_inputs[ndx].type	= decl.m_vertexAttributes[ndx].type;
		m_attributeNames[ndx]						= decl.m_vertexAttributes[ndx].name;
	}

	if (m_hasGeometryShader)
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToGeometryVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToGeometryVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToGeometryVaryings[ndx].flatshade;

			this->rr::GeometryShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
		for (size_t ndx = 0; ndx < decl.m_geometryToFragmentVaryings.size(); ++ndx)
		{
			this->rr::GeometryShader::m_outputs[ndx].type		= decl.m_geometryToFragmentVaryings[ndx].type;
			this->rr::GeometryShader::m_outputs[ndx].flatshade	= decl.m_geometryToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::GeometryShader::m_outputs[ndx];
		}
	}
	else
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToFragmentVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToFragmentVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
	}

	for (size_t ndx = 0; ndx < decl.m_fragmentOutputs.size(); ++ndx)
		this->rr::FragmentShader::m_outputs[ndx].type = decl.m_fragmentOutputs[ndx].type;

	// Set up uniforms

	for (size_t ndx = 0; ndx < decl.m_uniforms.size(); ++ndx)
	{
		this->m_uniforms[ndx].name = decl.m_uniforms[ndx].name;
		this->m_uniforms[ndx].type = decl.m_uniforms[ndx].type;
	}
}